

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuthorFileParser.hpp
# Opt level: O1

void __thiscall AuthorFileParser::writeAuthorList(AuthorFileParser *this,string *authorListFilename)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (authorListFilename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + authorListFilename->_M_string_length);
  BOWFileParser::writeWordList(&this->super_BOWFileParser,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void writeAuthorList(std::string authorListFilename)const{
        writeWordList(authorListFilename);
    }